

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O3

wchar_t prt_speed_aux(char *buf,wchar_t max,uint8_t *attr)

{
  wchar_t wVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  undefined1 uVar5;
  undefined4 in_register_00000034;
  
  wVar1 = (player->state).speed;
  *(undefined1 *)CONCAT44(in_register_00000034,max) = 1;
  *buf = '\0';
  if ((long)wVar1 < 0x6f) {
    if (wVar1 == L'n') goto LAB_001dbf11;
    pcVar4 = "Slow";
    uVar5 = 0xf;
  }
  else {
    pcVar4 = "Fast";
    uVar5 = 0xd;
  }
  *(undefined1 *)CONCAT44(in_register_00000034,max) = uVar5;
  if ((player->opts).opt[0x15] == false) {
    strnfmt(buf,0x20,"%s (%+d)",pcVar4,(ulong)(uint)(wVar1 + L'\xffffff92'));
  }
  else {
    uVar2 = ((uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                   [wVar1] * 10) / 10;
    strnfmt(buf,0x20,"%s (%d.%dx)",pcVar4,
            (ulong)("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                    [wVar1] / '\n'),(ulong)(uVar2 + (uVar2 / 5 & 0xfffffffe) * -5 & 0xffff));
  }
LAB_001dbf11:
  sVar3 = strlen(buf);
  return (wchar_t)sVar3;
}

Assistant:

static int prt_speed_aux(char buf[], int max, uint8_t *attr)
{
	int i = player->state.speed;
	const char *type = NULL;

	*attr = COLOUR_WHITE;
	buf[0] = 0;

	/* 110 is normal speed, and requires no display */
	if (i > 110) {
		*attr = COLOUR_L_GREEN;
		type = "Fast";
	} else if (i < 110) {
		*attr = COLOUR_L_UMBER;
		type = "Slow";
	}

	if (type && !OPT(player, effective_speed))
		strnfmt(buf, max, "%s (%+d)", type, (i - 110));
	else if (type && OPT(player, effective_speed))
	{
		int multiplier = 10 * extract_energy[i] / extract_energy[110];
		int int_mul = multiplier / 10;
		int dec_mul = multiplier % 10;
		strnfmt(buf, max, "%s (%d.%dx)", type, int_mul, dec_mul);
	}

	return strlen(buf);
}